

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int automataTest(char *filename,char *result,char *err,int options)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  FILE *__stream;
  char *pcVar6;
  FILE *__s;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  undefined8 *puVar12;
  byte bVar13;
  int iVar14;
  char *extraout_RDX;
  char *pcVar15;
  char *pcVar16;
  long lVar17;
  int iVar18;
  char expr [5000];
  xmlAutomataStatePtr states [1000];
  char acStack_3770 [499];
  undefined1 uStack_357d;
  char acStack_3570 [512];
  char *pcStack_3370;
  char *pcStack_3368;
  long local_3348;
  long local_3330;
  long local_3328;
  undefined8 local_3310;
  char local_3308 [5008];
  long local_1f78 [1001];
  
  nb_tests = nb_tests + 1;
  memset(local_1f78,0,8000);
  __stream = fopen64(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puVar12 = (undefined8 *)__xmlGenericError();
    pcVar1 = (code *)*puVar12;
    puVar12 = (undefined8 *)__xmlGenericErrorContext();
    (*pcVar1)(*puVar12,"Cannot open %s for reading\n",filename);
  }
  else {
    pcVar16 = "";
    pcVar7 = filename;
    pcVar6 = resultFilename(filename,"",".res");
    if (pcVar6 == (char *)0x0) {
      automataTest_cold_2();
      pcStack_3370 = filename;
      pcStack_3368 = result;
      pcVar6 = baseFilename(pcVar7);
      pcVar7 = ".tmp";
      if (extraout_RDX != (char *)0x0) {
        pcVar7 = extraout_RDX;
      }
      pcVar15 = "";
      if (pcVar16 != (char *)0x0) {
        pcVar15 = pcVar16;
      }
      strncpy(acStack_3570,pcVar7,499);
      iVar5 = snprintf(acStack_3770,499,"%s%s%s",pcVar15,pcVar6,acStack_3570);
      if (0x1f2 < iVar5) {
        uStack_357d = 0;
      }
      pcVar7 = strdup(acStack_3770);
      return (int)pcVar7;
    }
    __s = fopen64(pcVar6,"wb");
    if (__s == (FILE *)0x0) {
      automataTest_cold_1();
    }
    else {
      local_3348 = xmlNewAutomata();
      if (local_3348 == 0) {
        puVar12 = (undefined8 *)__xmlGenericError();
        pcVar1 = (code *)*puVar12;
        puVar12 = (undefined8 *)__xmlGenericErrorContext();
        (*pcVar1)(*puVar12,"Cannot create automata\n");
      }
      else {
        local_1f78[0] = xmlAutomataGetInitState(local_3348);
        if (local_1f78[0] != 0) {
          local_3330 = 0;
          local_3328 = 0;
          local_3310 = result;
LAB_0010a46a:
          iVar5 = 0;
LAB_0010a473:
          do {
            do {
              pcVar7 = fgets(local_3308,0x1194,__stream);
              cVar3 = local_3308[0];
              if (pcVar7 == (char *)0x0) {
LAB_0010abc5:
                fclose(__s);
                fclose(__stream);
                if (local_3328 != 0) {
                  xmlRegFreeRegexp();
                }
                pcVar7 = local_3310;
                if (local_3330 != 0) {
                  xmlRegFreeExecCtxt();
                }
                if (local_3348 != 0) {
                  xmlFreeAutomata(local_3348);
                }
                iVar5 = compareFiles(pcVar6,pcVar7);
                if (iVar5 != 0) {
                  fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar7);
                }
                unlink(pcVar6);
                free(pcVar6);
                return (uint)(iVar5 != 0);
              }
            } while (local_3308[0] == '#');
            sVar8 = strlen(local_3308);
            if (0 < (int)(uint)sVar8) {
              uVar9 = (ulong)((uint)sVar8 & 0x7fffffff);
              while (((ulong)(byte)local_3308[uVar9 - 1] < 0x21 &&
                     ((0x100002600U >> ((ulong)(byte)local_3308[uVar9 - 1] & 0x3f) & 1) != 0))) {
                sVar8 = uVar9 - 1;
                bVar2 = (long)uVar9 < 2;
                uVar9 = sVar8;
                if (bVar2) goto LAB_0010a4c6;
              }
              local_3308[uVar9 & 0xffffffff] = '\0';
              bVar13 = local_3308[1] ^ 0x20;
              if ((cVar3 == 't' && bVar13 == 0) && local_3348 != 0) {
                if ((byte)(local_3308[2] - 0x30U) < 10) {
                  iVar14 = 0;
                  pcVar7 = local_3308 + 2;
                  cVar3 = local_3308[2];
                  do {
                    iVar14 = (uint)(byte)(cVar3 - 0x30) + iVar14 * 10;
                    cVar3 = pcVar7[1];
                    pcVar7 = pcVar7 + 1;
                  } while ((byte)(cVar3 - 0x30U) < 10);
                  lVar17 = (long)iVar14;
                }
                else {
                  lVar17 = 0;
                  pcVar7 = local_3308 + 2;
                }
                if (*pcVar7 == ' ') {
                  if (local_1f78[lVar17] == 0) {
                    lVar10 = xmlAutomataNewState(local_3348);
                    local_1f78[lVar17] = lVar10;
                  }
                  cVar3 = pcVar7[1];
                  pcVar7 = pcVar7 + 1;
                  if ((byte)(cVar3 - 0x30U) < 10) {
                    iVar14 = 0;
                    do {
                      iVar14 = (uint)(byte)(cVar3 - 0x30) + iVar14 * 10;
                      cVar3 = pcVar7[1];
                      pcVar7 = pcVar7 + 1;
                    } while ((byte)(cVar3 - 0x30U) < 10);
                    lVar10 = (long)iVar14;
                  }
                  else {
                    lVar10 = 0;
                  }
                  if (*pcVar7 == ' ') {
                    if (local_1f78[lVar10] == 0) {
                      lVar11 = xmlAutomataNewState(local_3348);
                      local_1f78[lVar10] = lVar11;
                    }
                    xmlAutomataNewTransition
                              (local_3348,local_1f78[lVar17],local_1f78[lVar10],pcVar7 + 1);
                    goto LAB_0010a473;
                  }
                }
              }
              else {
                if ((cVar3 == 'e' && bVar13 == 0) && local_3348 != 0) {
                  if ((byte)(local_3308[2] - 0x30U) < 10) {
                    iVar14 = 0;
                    pcVar7 = local_3308 + 2;
                    cVar3 = local_3308[2];
                    do {
                      iVar14 = (uint)(byte)(cVar3 - 0x30) + iVar14 * 10;
                      cVar3 = pcVar7[1];
                      pcVar7 = pcVar7 + 1;
                    } while ((byte)(cVar3 - 0x30U) < 10);
                    lVar17 = (long)iVar14;
                  }
                  else {
                    lVar17 = 0;
                    pcVar7 = local_3308 + 2;
                  }
                  cVar3 = *pcVar7;
                  if (cVar3 == ' ') {
                    if (local_1f78[lVar17] == 0) {
                      lVar10 = xmlAutomataNewState(local_3348);
                      local_1f78[lVar17] = lVar10;
                    }
                    cVar4 = pcVar7[1];
                    if ((byte)(cVar4 - 0x30U) < 10) {
                      pcVar7 = pcVar7 + 2;
                      iVar14 = 0;
                      do {
                        iVar14 = (uint)(byte)(cVar4 - 0x30) + iVar14 * 10;
                        cVar4 = *pcVar7;
                        pcVar7 = pcVar7 + 1;
                      } while ((byte)(cVar4 - 0x30U) < 10);
                      lVar10 = (long)iVar14;
                    }
                    else {
                      lVar10 = 0;
                    }
                    if (local_1f78[lVar10] == 0) {
                      lVar11 = xmlAutomataNewState(local_3348);
                      local_1f78[lVar10] = lVar11;
                    }
                    xmlAutomataNewEpsilon(local_3348,local_1f78[lVar17],local_1f78[lVar10]);
                  }
                  else {
                    puVar12 = (undefined8 *)__xmlGenericError();
                    pcVar1 = (code *)*puVar12;
                    puVar12 = (undefined8 *)__xmlGenericErrorContext();
                    (*pcVar1)(*puVar12,"Bad line %s\n",local_3308);
                  }
                  if (cVar3 != ' ') goto LAB_0010abc5;
                  goto LAB_0010a473;
                }
                if ((cVar3 == 'f' && bVar13 == 0) && local_3348 != 0) {
                  iVar14 = 0;
                  if ((byte)(local_3308[2] - 0x30U) < 10) {
                    iVar14 = 0;
                    pcVar7 = local_3308 + 3;
                    cVar3 = local_3308[2];
                    do {
                      iVar14 = (uint)(byte)(cVar3 - 0x30) + iVar14 * 10;
                      cVar3 = *pcVar7;
                      pcVar7 = pcVar7 + 1;
                    } while ((byte)(cVar3 - 0x30U) < 10);
                  }
                  if (local_1f78[iVar14] == 0) {
                    puVar12 = (undefined8 *)__xmlGenericError();
                    pcVar1 = (code *)*puVar12;
                    puVar12 = (undefined8 *)__xmlGenericErrorContext();
                    (*pcVar1)(*puVar12,"Bad state %d : %s\n",iVar14,local_3308);
                    goto LAB_0010abc5;
                  }
                  xmlAutomataSetFinalState(local_3348,local_1f78[iVar14]);
                  goto LAB_0010a473;
                }
                if ((cVar3 != 'c' || bVar13 != 0) || local_3348 == 0) {
                  if ((local_3308[1] == 0x2d && cVar3 == '-') && local_3348 != 0) {
                    local_3328 = xmlAutomataCompile();
                    xmlFreeAutomata(local_3348);
                    local_3348 = 0;
                    if (local_3328 != 0) goto LAB_0010a473;
                    puVar12 = (undefined8 *)__xmlGenericError();
                    pcVar1 = (code *)*puVar12;
                    puVar12 = (undefined8 *)__xmlGenericErrorContext();
                    local_3328 = 0;
                    (*pcVar1)(*puVar12,"Failed to compile the automata");
                    local_3348 = 0;
                    goto LAB_0010abc5;
                  }
                  if (local_3308[1] == 0x3e && cVar3 == '=') {
                    if (local_3328 == 0) {
                      fwrite("=> failed not compiled\n",0x17,1,__s);
                    }
                    else {
                      if (local_3330 == 0) {
                        local_3330 = xmlRegNewExecCtxt(local_3328,0,0);
                      }
                      if (iVar5 == 0) {
                        iVar5 = xmlRegExecPushString(local_3330,0,0);
                      }
                      if (iVar5 == 1) {
                        pcVar7 = "=> Passed\n";
LAB_0010aaeb:
                        sVar8 = 10;
LAB_0010aaee:
                        fwrite(pcVar7,sVar8,1,__s);
                      }
                      else {
                        if (iVar5 + 1U < 2) {
                          pcVar7 = "=> Failed\n";
                          goto LAB_0010aaeb;
                        }
                        if (iVar5 < 0) {
                          sVar8 = 9;
                          pcVar7 = "=> Error\n";
                          goto LAB_0010aaee;
                        }
                      }
                      xmlRegFreeExecCtxt(local_3330);
                      local_3330 = 0;
                    }
                    goto LAB_0010a46a;
                  }
                  if (local_3328 == 0) {
                    puVar12 = (undefined8 *)__xmlGenericError();
                    pcVar1 = (code *)*puVar12;
                    puVar12 = (undefined8 *)__xmlGenericErrorContext();
                    (*pcVar1)(*puVar12,"Unexpected line %s\n",local_3308);
                    local_3328 = 0;
                  }
                  else {
                    if (local_3330 == 0) {
                      local_3330 = xmlRegNewExecCtxt(local_3328,0,0);
                    }
                    iVar5 = xmlRegExecPushString(local_3330,local_3308,0);
                  }
                  goto LAB_0010a473;
                }
                if ((byte)(local_3308[2] - 0x30U) < 10) {
                  iVar14 = 0;
                  pcVar7 = local_3308 + 2;
                  cVar3 = local_3308[2];
                  do {
                    iVar14 = (uint)(byte)(cVar3 - 0x30) + iVar14 * 10;
                    cVar3 = pcVar7[1];
                    pcVar7 = pcVar7 + 1;
                  } while ((byte)(cVar3 - 0x30U) < 10);
                  lVar17 = (long)iVar14;
                }
                else {
                  lVar17 = 0;
                  pcVar7 = local_3308 + 2;
                }
                if (*pcVar7 != ' ') goto LAB_0010aba4;
                if (local_1f78[lVar17] == 0) {
                  lVar10 = xmlAutomataNewState(local_3348);
                  local_1f78[lVar17] = lVar10;
                }
                cVar3 = pcVar7[1];
                pcVar7 = pcVar7 + 1;
                if ((byte)(cVar3 - 0x30U) < 10) {
                  iVar14 = 0;
                  do {
                    iVar14 = (uint)(byte)(cVar3 - 0x30) + iVar14 * 10;
                    cVar3 = pcVar7[1];
                    pcVar7 = pcVar7 + 1;
                  } while ((byte)(cVar3 - 0x30U) < 10);
                  lVar10 = (long)iVar14;
                }
                else {
                  lVar10 = 0;
                }
                if (*pcVar7 == ' ') {
                  if (local_1f78[lVar10] == 0) {
                    lVar11 = xmlAutomataNewState(local_3348);
                    local_1f78[lVar10] = lVar11;
                  }
                  cVar3 = pcVar7[1];
                  pcVar7 = pcVar7 + 1;
                  iVar14 = 0;
                  if ((byte)(cVar3 - 0x30U) < 10) {
                    iVar14 = 0;
                    do {
                      iVar14 = (uint)(byte)(cVar3 - 0x30) + iVar14 * 10;
                      cVar3 = pcVar7[1];
                      pcVar7 = pcVar7 + 1;
                    } while ((byte)(cVar3 - 0x30U) < 10);
                  }
                  if (*pcVar7 == ' ') {
                    cVar3 = pcVar7[1];
                    pcVar7 = pcVar7 + 1;
                    iVar18 = 0;
                    if ((byte)(cVar3 - 0x30U) < 10) {
                      iVar18 = 0;
                      do {
                        iVar18 = (uint)(byte)(cVar3 - 0x30) + iVar18 * 10;
                        cVar3 = pcVar7[1];
                        pcVar7 = pcVar7 + 1;
                      } while ((byte)(cVar3 - 0x30U) < 10);
                    }
                    if (*pcVar7 == ' ') {
                      xmlAutomataNewCountTrans
                                (local_3348,local_1f78[lVar17],local_1f78[lVar10],pcVar7 + 1,iVar14,
                                 iVar18);
                      goto LAB_0010a473;
                    }
                  }
                }
              }
LAB_0010aba4:
              puVar12 = (undefined8 *)__xmlGenericError();
              pcVar1 = (code *)*puVar12;
              puVar12 = (undefined8 *)__xmlGenericErrorContext();
              (*pcVar1)(*puVar12,"Bad line %s\n",local_3308);
              goto LAB_0010abc5;
            }
LAB_0010a4c6:
            local_3308[(int)sVar8] = '\0';
          } while( true );
        }
        puVar12 = (undefined8 *)__xmlGenericError();
        pcVar1 = (code *)*puVar12;
        puVar12 = (undefined8 *)__xmlGenericErrorContext();
        (*pcVar1)(*puVar12,"Cannot get start state\n");
        xmlFreeAutomata(local_3348);
      }
      fclose(__stream);
    }
  }
  return -1;
}

Assistant:

static int
automataTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED, int options ATTRIBUTE_UNUSED) {
    FILE *input, *output;
    char *temp;
    char expr[5000];
    int len;
    int ret;
    int i;
    int res = 0;
    xmlAutomataPtr am;
    xmlAutomataStatePtr states[1000];
    xmlRegexpPtr regexp = NULL;
    xmlRegExecCtxtPtr exec = NULL;

    nb_tests++;

    for (i = 0;i<1000;i++)
	states[i] = NULL;

    input = fopen(filename, "rb");
    if (input == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"Cannot open %s for reading\n", filename);
	return(-1);
    }
    temp = resultFilename(filename, "", ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    output = fopen(temp, "wb");
    if (output == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }

    am = xmlNewAutomata();
    if (am == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"Cannot create automata\n");
	fclose(input);
	return(-1);
    }
    states[0] = xmlAutomataGetInitState(am);
    if (states[0] == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"Cannot get start state\n");
	xmlFreeAutomata(am);
	fclose(input);
	return(-1);
    }
    ret = 0;

    while (fgets(expr, 4500, input) != NULL) {
	if (expr[0] == '#')
	    continue;
	len = strlen(expr);
	len--;
	while ((len >= 0) &&
	       ((expr[len] == '\n') || (expr[len] == '\t') ||
		(expr[len] == '\r') || (expr[len] == ' '))) len--;
	expr[len + 1] = 0;
	if (len >= 0) {
	    if ((am != NULL) && (expr[0] == 't') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		xmlAutomataNewTransition(am, states[from], states[to],
			                 BAD_CAST ptr, NULL);
	    } else if ((am != NULL) && (expr[0] == 'e') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		xmlAutomataNewEpsilon(am, states[from], states[to]);
	    } else if ((am != NULL) && (expr[0] == 'f') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int state;

		state = scanNumber(&ptr);
		if (states[state] == NULL) {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad state %d : %s\n", state, expr);
		    break;
		}
		xmlAutomataSetFinalState(am, states[state]);
	    } else if ((am != NULL) && (expr[0] == 'c') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;
		int min, max;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		min = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		max = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		xmlAutomataNewCountTrans(am, states[from], states[to],
			                 BAD_CAST ptr, min, max, NULL);
	    } else if ((am != NULL) && (expr[0] == '-') && (expr[1] == '-')) {
		/* end of the automata */
		regexp = xmlAutomataCompile(am);
		xmlFreeAutomata(am);
		am = NULL;
		if (regexp == NULL) {
		    xmlGenericError(xmlGenericErrorContext,
			    "Failed to compile the automata");
		    break;
		}
	    } else if ((expr[0] == '=') && (expr[1] == '>')) {
		if (regexp == NULL) {
		    fprintf(output, "=> failed not compiled\n");
		} else {
		    if (exec == NULL)
			exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		    if (ret == 0) {
			ret = xmlRegExecPushString(exec, NULL, NULL);
		    }
		    if (ret == 1)
			fprintf(output, "=> Passed\n");
		    else if ((ret == 0) || (ret == -1))
			fprintf(output, "=> Failed\n");
		    else if (ret < 0)
			fprintf(output, "=> Error\n");
		    xmlRegFreeExecCtxt(exec);
		    exec = NULL;
		}
		ret = 0;
	    } else if (regexp != NULL) {
		if (exec == NULL)
		    exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		ret = xmlRegExecPushString(exec, BAD_CAST expr, NULL);
	    } else {
		xmlGenericError(xmlGenericErrorContext,
			"Unexpected line %s\n", expr);
	    }
	}
    }
    fclose(output);
    fclose(input);
    if (regexp != NULL)
	xmlRegFreeRegexp(regexp);
    if (exec != NULL)
	xmlRegFreeExecCtxt(exec);
    if (am != NULL)
	xmlFreeAutomata(am);

    ret = compareFiles(temp, result);
    if (ret) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        res = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(res);
}